

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

void Diligent::CopyPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *SrcDesc,
               PipelineResourceSignatureDesc *DstDesc,array<unsigned_short,_4UL> *ResourceOffsets)

{
  PipelineResourceDesc *pPVar1;
  ImmutableSamplerDesc *pIVar2;
  undefined8 uVar3;
  size_t i_1;
  PipelineResourceDesc *__seed;
  ImmutableSamplerDesc *pIVar4;
  Char *pCVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  Uint32 i;
  ulong uVar12;
  byte bVar13;
  string msg;
  
  bVar13 = 0;
  __seed = FixedLinearAllocator::ConstructArray<Diligent::PipelineResourceDesc>
                     (Allocator,(ulong)SrcDesc->NumResources);
  pIVar4 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                     (Allocator,(ulong)SrcDesc->NumImmutableSamplers);
  lVar9 = 0;
  for (uVar12 = 0; uVar8 = (ulong)SrcDesc->NumResources, uVar12 < uVar8; uVar12 = uVar12 + 1) {
    pPVar1 = SrcDesc->Resources;
    *(undefined8 *)(&__seed->ResourceType + lVar9) = *(undefined8 *)(&pPVar1->ResourceType + lVar9);
    puVar11 = (undefined8 *)((long)&pPVar1->Name + lVar9);
    uVar3 = puVar11[1];
    puVar10 = (undefined8 *)((long)&__seed->Name + lVar9);
    *puVar10 = *puVar11;
    puVar10[1] = uVar3;
    pcVar6 = *(char **)((long)&pPVar1->Name + lVar9);
    if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
      FormatString<char[26],char[49]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SrcRes.Name != nullptr && SrcRes.Name[0] != \'\\0\'",
                 (char (*) [49])__seed);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1db);
      std::__cxx11::string::~string((string *)&msg);
      pcVar6 = *(char **)((long)&pPVar1->Name + lVar9);
    }
    pCVar5 = FixedLinearAllocator::CopyString(Allocator,pcVar6,0);
    *(Char **)((long)&__seed->Name + lVar9) = pCVar5;
    ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar9] + 1] =
         ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar9] + 1] + 1;
    lVar9 = lVar9 + 0x18;
  }
  if (uVar8 != 0) {
    std::_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>::
    _Temporary_buffer((_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>
                       *)&msg,__seed,uVar8 + 1 >> 1);
    if (msg.field_2._M_allocated_capacity == 0) {
      std::
      __inplace_stable_sort<Diligent::PipelineResourceDesc*,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                (__seed,__seed + uVar8);
    }
    else {
      std::
      __stable_sort_adaptive<Diligent::PipelineResourceDesc*,Diligent::PipelineResourceDesc*,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                (__seed,__seed + uVar8);
    }
    std::_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>::
    ~_Temporary_buffer((_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>
                        *)&msg);
  }
  for (lVar9 = 1; lVar9 != 4; lVar9 = lVar9 + 1) {
    ResourceOffsets->_M_elems[lVar9] =
         ResourceOffsets->_M_elems[lVar9] + ResourceOffsets->_M_elems[lVar9 + -1];
  }
  lVar9 = 0x10;
  for (uVar12 = 0; uVar12 < SrcDesc->NumImmutableSamplers; uVar12 = uVar12 + 1) {
    pIVar2 = SrcDesc->ImmutableSamplers;
    puVar10 = (undefined8 *)((long)(pIVar2->Desc).BorderColor + lVar9 + -0x3c);
    puVar11 = (undefined8 *)((long)(pIVar4->Desc).BorderColor + lVar9 + -0x3c);
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar11 = *puVar10;
      puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
    }
    pcVar6 = *(char **)((long)(pIVar2->Desc).BorderColor + lVar9 + -0x34);
    if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
      FormatString<char[26],char[81]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != \'\\0\'"
                 ,(char (*) [81])0x0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1f6);
      std::__cxx11::string::~string((string *)&msg);
      pcVar6 = *(char **)((long)(pIVar2->Desc).BorderColor + lVar9 + -0x34);
    }
    pCVar5 = FixedLinearAllocator::CopyString(Allocator,pcVar6,0);
    *(Char **)((long)(pIVar4->Desc).BorderColor + lVar9 + -0x34) = pCVar5;
    pcVar6 = FixedLinearAllocator::CopyString
                       (Allocator,*(char **)((long)(pIVar2->Desc).BorderColor + lVar9 + -0x2c),0);
    if (pcVar6 == (Char *)0x0) {
      pcVar6 = "";
    }
    *(char **)((long)(pIVar4->Desc).BorderColor + lVar9 + -0x2c) = pcVar6;
    lVar9 = lVar9 + 0x48;
  }
  DstDesc->Resources = __seed;
  DstDesc->ImmutableSamplers = pIVar4;
  if (SrcDesc->UseCombinedTextureSamplers != false) {
    pCVar5 = FixedLinearAllocator::CopyString(Allocator,SrcDesc->CombinedSamplerSuffix,0);
    DstDesc->CombinedSamplerSuffix = pCVar5;
  }
  return;
}

Assistant:

void CopyPipelineResourceSignatureDesc(FixedLinearAllocator&                                            Allocator,
                                       const PipelineResourceSignatureDesc&                             SrcDesc,
                                       PipelineResourceSignatureDesc&                                   DstDesc,
                                       std::array<Uint16, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES + 1>& ResourceOffsets)
{
    PipelineResourceDesc* pResources = Allocator.ConstructArray<PipelineResourceDesc>(SrcDesc.NumResources);
    ImmutableSamplerDesc* pSamplers  = Allocator.ConstructArray<ImmutableSamplerDesc>(SrcDesc.NumImmutableSamplers);

    for (Uint32 i = 0; i < SrcDesc.NumResources; ++i)
    {
        const PipelineResourceDesc& SrcRes = SrcDesc.Resources[i];
        PipelineResourceDesc&       DstRes = pResources[i];

        DstRes = SrcRes;
        VERIFY_EXPR(SrcRes.Name != nullptr && SrcRes.Name[0] != '\0');
        DstRes.Name = Allocator.CopyString(SrcRes.Name);

        ++ResourceOffsets[size_t{DstRes.VarType} + 1];
    }

    // Sort resources by variable type (all static -> all mutable -> all dynamic).
    // NB: It is crucial to use stable sort to make sure that relative
    //     positions of resources are preserved.
    //     std::sort may reposition equal elements differently depending on
    //     the original arrangement, e.g.:
    //          B1 B2 A1 A2 -> A1 A2 B1 B2
    //          A1 B1 A2 B2 -> A2 A1 B2 B1
    std::stable_sort(pResources, pResources + SrcDesc.NumResources,
                     [](const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs) {
                         return lhs.VarType < rhs.VarType;
                     });

    for (size_t i = 1; i < ResourceOffsets.size(); ++i)
        ResourceOffsets[i] += ResourceOffsets[i - 1];

    for (Uint32 i = 0; i < SrcDesc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SrcSam = SrcDesc.ImmutableSamplers[i];
        ImmutableSamplerDesc&       DstSam = pSamplers[i];

        DstSam = SrcSam;
        VERIFY_EXPR(SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != '\0');
        DstSam.SamplerOrTextureName = Allocator.CopyString(SrcSam.SamplerOrTextureName);
        DstSam.Desc.Name            = Allocator.CopyString(SrcSam.Desc.Name);
        if (!DstSam.Desc.Name)
            DstSam.Desc.Name = "";
    }

    DstDesc.Resources         = pResources;
    DstDesc.ImmutableSamplers = pSamplers;

    if (SrcDesc.UseCombinedTextureSamplers)
        DstDesc.CombinedSamplerSuffix = Allocator.CopyString(SrcDesc.CombinedSamplerSuffix);
}